

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3423::AddLayer
          (ChElementShellANCF_3423 *this,double thickness,double theta,
          shared_ptr<chrono::fea::ChMaterialShellANCF> *material)

{
  __shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2> local_190;
  Layer local_180;
  
  std::__shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_190,
             &material->
              super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>);
  Layer::Layer(&local_180,this,thickness,theta,
               (shared_ptr<chrono::fea::ChMaterialShellANCF> *)&local_190);
  std::
  vector<chrono::fea::ChElementShellANCF_3423::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3423::Layer>_>
  ::emplace_back<chrono::fea::ChElementShellANCF_3423::Layer>(&this->m_layers,&local_180);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_180.m_material.
              super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_190._M_refcount);
  return;
}

Assistant:

void ChElementShellANCF_3423::AddLayer(double thickness, double theta, std::shared_ptr<ChMaterialShellANCF> material) {
    m_layers.push_back(Layer(this, thickness, theta, material));
}